

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cpp
# Opt level: O2

void eval(Board *brd,Block *block,int *ele,int *ht)

{
  uint uVar1;
  uint uVar2;
  pair<int,_int> pVar3;
  
  Board::place(brd,block);
  pVar3 = Board::eliminate(brd,block);
  *ele = pVar3.first;
  uVar1 = 0x14;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0) {
      return;
    }
    uVar1 = uVar2 - 1;
  } while (brd->rows[uVar2] == 0x801);
  *ht = uVar2;
  return;
}

Assistant:

void eval(Board& brd, const Block& block, int& ele, int& ht) {
    int basenum = brd.place(block);
    pair<int, int> elim=brd.eliminate(&block);
    ele = elim.first;
    for (int i = MAPHEIGHT; i > 0; --i)
        if (brd.rows[i]!=Board::EMPTY_ROW) {
            ht = i;
            break;
        }
}